

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::SigmoidParameter::InternalSerializeWithCachedSizesToArray
          (SigmoidParameter *this,bool deterministic,uint8 *target)

{
  void *pvVar1;
  bool bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    uVar5 = (ulong)this->engine_;
    pbVar3 = target + 1;
    *target = '\b';
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar3 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar3 = pbVar3 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
    }
    *pbVar3 = (byte)uVar6;
    target = pbVar3 + 1;
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SigmoidParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SigmoidParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.SigmoidParameter.Engine engine = 1 [default = DEFAULT];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->engine(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SigmoidParameter)
  return target;
}